

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O0

void NULLCCanvas::CanvasDrawPointInternal(uint x,uint y,double alpha,Canvas *ptr)

{
  float *pfVar1;
  float *pixel;
  Canvas *ptr_local;
  double alpha_local;
  uint y_local;
  uint x_local;
  
  if (ptr == (Canvas *)0x0) {
    nullcThrowError("ERROR: Canvas object is nullptr");
  }
  else if ((x < (uint)ptr->width) && (y < (uint)ptr->height)) {
    pfVar1 = (float *)((ptr->data).ptr + (ulong)(y * ptr->width * 4 + x * 4) * 4);
    *pfVar1 = (float)((double)ptr->color[0] * alpha + (double)*pfVar1 * (1.0 - alpha));
    pfVar1[1] = (float)((double)ptr->color[1] * alpha + (double)pfVar1[1] * (1.0 - alpha));
    pfVar1[2] = (float)((double)ptr->color[2] * alpha + (double)pfVar1[2] * (1.0 - alpha));
    pfVar1[3] = 1.0;
  }
  return;
}

Assistant:

void CanvasDrawPointInternal(unsigned x, unsigned y, double alpha, Canvas* ptr)
	{
		if(!ptr)
		{
			nullcThrowError("ERROR: Canvas object is nullptr");
			return;
		}
		if(x < (unsigned)ptr->width && y < (unsigned)ptr->height)
		{
			float *pixel = &((float*)ptr->data.ptr)[y * ptr->width * 4 + x * 4];

			pixel[0] = float(ptr->color[0] * alpha + pixel[0] * (1.0 - alpha));
			pixel[1] = float(ptr->color[1] * alpha + pixel[1] * (1.0 - alpha));
			pixel[2] = float(ptr->color[2] * alpha + pixel[2] * (1.0 - alpha));
			pixel[3] = 1.0f;
		}
	}